

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::logSubmit
          (PipelineBarrier *this,TestLog *log,size_t commandIndex)

{
  int iVar1;
  MessageBuilder *pMVar2;
  undefined4 extraout_var;
  char *local_260;
  Bitfield<32UL> local_220;
  Bitfield<32UL> local_208;
  Bitfield<32UL> local_1f0;
  Bitfield<32UL> local_1d8;
  char *local_1c0;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  size_t local_20;
  size_t commandIndex_local;
  TestLog *log_local;
  PipelineBarrier *this_local;
  
  local_20 = commandIndex;
  commandIndex_local = (size_t)log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x137f180);
  iVar1 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])();
  local_1b8[0] = (char *)CONCAT44(extraout_var,iVar1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  if (this->m_type == TYPE_GLOBAL) {
    local_260 = "Global pipeline barrier";
  }
  else {
    local_260 = "Image pipeline barrier";
    if (this->m_type == TYPE_BUFFER) {
      local_260 = "Buffer pipeline barrier";
    }
  }
  local_1c0 = local_260;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", srcStages: ");
  ::vk::getPipelineStageFlagsStr(&local_1d8,this->m_srcStages);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])", srcAccesses: ");
  ::vk::getAccessFlagsStr(&local_1f0,this->m_srcAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", dstStages: ");
  ::vk::getPipelineStageFlagsStr(&local_208,this->m_dstStages);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_208);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])", dstAccesses: ");
  ::vk::getAccessFlagsStr(&local_220,this->m_dstAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_220);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void PipelineBarrier::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName()
		<< " " << (m_type == TYPE_GLOBAL ? "Global pipeline barrier"
					: m_type == TYPE_BUFFER ? "Buffer pipeline barrier"
					: "Image pipeline barrier")
		<< ", srcStages: " << vk::getPipelineStageFlagsStr(m_srcStages) << ", srcAccesses: " << vk::getAccessFlagsStr(m_srcAccesses)
		<< ", dstStages: " << vk::getPipelineStageFlagsStr(m_dstStages) << ", dstAccesses: " << vk::getAccessFlagsStr(m_dstAccesses) << TestLog::EndMessage;
}